

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O3

void lvm_debug_d_s(char *ptr,string *str,size_t temp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int i;
  int iVar5;
  int iVar6;
  uint data_num;
  string data_adr;
  stringstream ss;
  int local_204;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  uint local_1e0;
  int local_1dc;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (data_ptr == ptr) {
    puts("DATA:");
  }
  else if (stack_ptr == ptr) {
    printf("STACK:SP--->%08X\n",(ulong)registe_ptr->SP);
  }
  std::__cxx11::string::substr((ulong)&local_1d8,(ulong)str);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_1d8);
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if (iVar2 == 0) {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
    std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(char *)local_200,local_1f8);
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(char *)local_1d8,local_1d0);
  }
  std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
  local_204 = 1;
  iVar2 = -0x10;
  iVar5 = 0;
  uVar4 = 0;
  do {
    printf("%08X\t",(ulong)uVar4);
    local_1e0 = uVar4 + 0x10;
    iVar6 = 0;
    local_1dc = iVar2;
    do {
      iVar3 = iVar2;
      printf("%02X ",(long)ptr[uVar4 + iVar6]);
      iVar6 = iVar6 + 1;
      iVar2 = iVar3 + 1;
    } while (iVar6 != 0x10);
    putchar(0x7c);
    do {
      cVar1 = ptr[iVar3 + 1];
      iVar2 = 0x2a;
      if ((cVar1 != '\n') && (cVar1 != '\r')) {
        iVar2 = (int)cVar1;
      }
      putchar(iVar2);
      iVar3 = iVar3 + 1;
    } while (iVar3 < 0x10 - local_204);
    putchar(10);
    iVar5 = iVar5 + 1;
    local_204 = local_204 + -0x10;
    iVar2 = local_1dc + 0x10;
    uVar4 = local_1e0;
  } while (iVar5 != 3);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return;
}

Assistant:

void lvm_debug_d_s(char * ptr,std::string str,size_t temp) {
	if (ptr == data_ptr)
		printf("DATA:\n");
	else if (ptr == stack_ptr)
		printf("STACK:SP--->%08X\n", registe_ptr->SP);
	std::string data_adr = str.substr(temp + 1);
	std::stringstream ss;
	ss.str("");
	unsigned data_num{ 0 };
	if (data_adr.substr(0, 2) == "0x")//16进制字符串
	{
		ss << std::hex << data_adr.substr(2);
		ss >> data_num;
	}
	else
	{
		ss << data_adr;
		ss >> data_num;
	}
	int m{ 0 };
	for (int i = 0; i < 3; i++)
	{
		printf("%08X	", data_num + m);
		for (int h = 0; h< 16; h++)
		{
			printf("%02X ", (unsigned char *)ptr[data_num + m]);
			++m;
		}
		int p = m - 16;
		putchar('|');
		for (int o = p; o< m; o++)
		{
			if (ptr[data_num + o] == '\x0a' || ptr[data_num + o] == '\x0d') putchar('*');
			else putchar(ptr[data_num + o]);
		}
		printf("\n");
	}
}